

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
kainjow::mustache::html_escape<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,mustache *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  bool bVar1;
  reference pcVar2;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 *local_60;
  undefined8 local_58;
  char local_49;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char ch;
  const_iterator __end0;
  const_iterator __begin0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end0._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffb8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end0);
    local_49 = *pcVar2;
    switch(local_49) {
    case '\"':
      local_ae = 0x26;
      local_ad = 0x71;
      local_ac = 0x75;
      local_ab = 0x6f;
      local_aa = 0x74;
      local_a9 = 0x3b;
      local_a8 = &local_ae;
      local_a0 = 6;
      std::__cxx11::string::append(__return_storage_ptr__,local_a8,6);
      break;
    default:
      std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
      break;
    case '&':
      local_65 = 0x26;
      local_64 = 0x61;
      local_63 = 0x6d;
      local_62 = 0x70;
      local_61 = 0x3b;
      local_60 = &local_65;
      local_58 = 5;
      std::__cxx11::string::append(__return_storage_ptr__,local_60,5);
      break;
    case '\'':
      local_c6 = 0x26;
      local_c5 = 0x61;
      local_c4 = 0x70;
      local_c3 = 0x6f;
      local_c2 = 0x73;
      local_c1 = 0x3b;
      local_c0 = &local_c6;
      local_b8 = 6;
      std::__cxx11::string::append(__return_storage_ptr__,local_c0,6);
      break;
    case '<':
      local_7c = 0x26;
      local_7b = 0x6c;
      local_7a = 0x74;
      local_79 = 0x3b;
      local_78 = &local_7c;
      local_70 = 4;
      std::__cxx11::string::append(__return_storage_ptr__,local_78,4);
      break;
    case '>':
      local_94 = 0x26;
      local_93 = 0x67;
      local_92 = 0x74;
      local_91 = 0x3b;
      local_90 = &local_94;
      local_88 = 4;
      std::__cxx11::string::append(__return_storage_ptr__,local_90,4);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

string_type html_escape(const string_type& s) {
    string_type ret;
    ret.reserve(s.size()*2);
    for (const auto ch : s) {
        switch (ch) {
            case '&':
                ret.append({'&','a','m','p',';'});
                break;
            case '<':
                ret.append({'&','l','t',';'});
                break;
            case '>':
                ret.append({'&','g','t',';'});
                break;
            case '\"':
                ret.append({'&','q','u','o','t',';'});
                break;
            case '\'':
                ret.append({'&','a','p','o','s',';'});
                break;
            default:
                ret.append(1, ch);
                break;
        }
    }
    return ret;
}